

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int jumponcond(FuncState *fs,expdesc *e,int cond)

{
  undefined4 in_EDX;
  int *in_RSI;
  long *in_RDI;
  Instruction ie;
  int in_stack_ffffffffffffffd8;
  OpCode in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((*in_RSI == 0xb) &&
     (in_stack_ffffffffffffffe0 = *(uint *)(*(long *)(*in_RDI + 0x18) + (long)in_RSI[2] * 4),
     (in_stack_ffffffffffffffe0 & 0x3f) == 0x13)) {
    *(int *)(in_RDI + 6) = (int)in_RDI[6] + -1;
    local_4 = condjump((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0,0x119313);
  }
  else {
    discharge2anyreg((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                     (expdesc *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    freeexp((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
            (expdesc *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_4 = condjump((FuncState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0,0x11935a);
  }
  return local_4;
}

Assistant:

static int jumponcond(FuncState*fs,expdesc*e,int cond){
if(e->k==VRELOCABLE){
Instruction ie=getcode(fs,e);
if(GET_OPCODE(ie)==OP_NOT){
fs->pc--;
return condjump(fs,OP_TEST,GETARG_B(ie),0,!cond);
}
}
discharge2anyreg(fs,e);
freeexp(fs,e);
return condjump(fs,OP_TESTSET,((1<<8)-1),e->u.s.info,cond);
}